

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::build_workgroup_size
          (CompilerGLSL *this,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arguments,SpecializationConstant *wg_x,SpecializationConstant *wg_y,
          SpecializationConstant *wg_z)

{
  SpecializationConstant *pSVar1;
  uint32_t uVar2;
  SPIRConstant *pSVar3;
  bool local_1d9;
  spirv_cross local_1d8 [36];
  uint32_t local_1b4;
  spirv_cross local_1b0 [32];
  spirv_cross local_190 [32];
  spirv_cross local_170 [32];
  spirv_cross local_150 [36];
  uint32_t local_12c;
  spirv_cross local_128 [32];
  spirv_cross local_108 [32];
  spirv_cross local_e8 [32];
  spirv_cross local_c8 [36];
  uint32_t local_a4;
  spirv_cross local_a0 [32];
  spirv_cross local_80 [32];
  spirv_cross local_60 [38];
  bool local_3a;
  undefined1 local_39;
  bool use_local_size_id;
  SPIREntryPoint *pSStack_38;
  bool builtin_workgroup;
  SPIREntryPoint *execution;
  SpecializationConstant *wg_z_local;
  SpecializationConstant *wg_y_local;
  SpecializationConstant *wg_x_local;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *arguments_local;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)wg_z;
  wg_z_local = wg_y;
  wg_y_local = wg_x;
  wg_x_local = (SpecializationConstant *)arguments;
  arguments_local =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)this;
  pSStack_38 = Compiler::get_entry_point(&this->super_Compiler);
  local_39 = (pSStack_38->workgroup_size).constant != 0;
  local_1d9 = false;
  if (!(bool)local_39) {
    local_1d9 = Bitset::get(&pSStack_38->flags,0x26);
  }
  local_3a = local_1d9;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_y_local);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    if (((local_3a & 1U) == 0) || ((pSStack_38->workgroup_size).id_x == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (local_c8,(char (*) [16])"local_size_x = ",&(pSStack_38->workgroup_size).x);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      ::std::__cxx11::string::~string((string *)local_c8);
    }
    else {
      pSVar3 = Compiler::get<spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSStack_38->workgroup_size).id_x);
      local_a4 = SPIRConstant::scalar(pSVar3,0,0);
      join<char_const(&)[16],unsigned_int>(local_a0,(char (*) [16])"local_size_x = ",&local_a4);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      ::std::__cxx11::string::~string((string *)local_a0);
    }
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_y_local);
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (local_80,(char (*) [16])"local_size_x = ",&pSVar3->specialization_constant_macro_name
              );
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    ::std::__cxx11::string::~string((string *)local_80);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (local_60,(char (*) [19])"local_size_x_id = ",&wg_y_local->constant_id);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_z_local);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    if (((local_3a & 1U) == 0) || ((pSStack_38->workgroup_size).id_y == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (local_150,(char (*) [16])"local_size_y = ",&(pSStack_38->workgroup_size).y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      ::std::__cxx11::string::~string((string *)local_150);
    }
    else {
      pSVar3 = Compiler::get<spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSStack_38->workgroup_size).id_y);
      local_12c = SPIRConstant::scalar(pSVar3,0,0);
      join<char_const(&)[16],unsigned_int>(local_128,(char (*) [16])"local_size_y = ",&local_12c);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      ::std::__cxx11::string::~string((string *)local_128);
    }
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_z_local);
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (local_108,(char (*) [16])"local_size_y = ",
               &pSVar3->specialization_constant_macro_name);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    ::std::__cxx11::string::~string((string *)local_108);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (local_e8,(char (*) [19])"local_size_y_id = ",&wg_z_local->constant_id);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    ::std::__cxx11::string::~string((string *)local_e8);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)execution);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    if (((local_3a & 1U) == 0) || ((pSStack_38->workgroup_size).id_z == 0)) {
      join<char_const(&)[16],unsigned_int&>
                (local_1d8,(char (*) [16])"local_size_z = ",&(pSStack_38->workgroup_size).z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
      ::std::__cxx11::string::~string((string *)local_1d8);
    }
    else {
      pSVar3 = Compiler::get<spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSStack_38->workgroup_size).id_z);
      local_1b4 = SPIRConstant::scalar(pSVar3,0,0);
      join<char_const(&)[16],unsigned_int>(local_1b0,(char (*) [16])"local_size_z = ",&local_1b4);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)pSVar1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
      ::std::__cxx11::string::~string((string *)local_1b0);
    }
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)execution);
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (local_190,(char (*) [16])"local_size_z = ",
               &pSVar3->specialization_constant_macro_name);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    ::std::__cxx11::string::~string((string *)local_190);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (local_170,(char (*) [19])"local_size_z_id = ",(uint *)&execution->field_0x4);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    ::std::__cxx11::string::~string((string *)local_170);
  }
  return;
}

Assistant:

void CompilerGLSL::build_workgroup_size(SmallVector<string> &arguments, const SpecializationConstant &wg_x,
                                        const SpecializationConstant &wg_y, const SpecializationConstant &wg_z)
{
	auto &execution = get_entry_point();
	bool builtin_workgroup = execution.workgroup_size.constant != 0;
	bool use_local_size_id = !builtin_workgroup && execution.flags.get(ExecutionModeLocalSizeId);

	if (wg_x.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_x_id = ", wg_x.constant_id));
		else
			arguments.push_back(join("local_size_x = ", get<SPIRConstant>(wg_x.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_x)
		arguments.push_back(join("local_size_x = ", get<SPIRConstant>(execution.workgroup_size.id_x).scalar()));
	else
		arguments.push_back(join("local_size_x = ", execution.workgroup_size.x));

	if (wg_y.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_y_id = ", wg_y.constant_id));
		else
			arguments.push_back(join("local_size_y = ", get<SPIRConstant>(wg_y.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_y)
		arguments.push_back(join("local_size_y = ", get<SPIRConstant>(execution.workgroup_size.id_y).scalar()));
	else
		arguments.push_back(join("local_size_y = ", execution.workgroup_size.y));

	if (wg_z.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_z_id = ", wg_z.constant_id));
		else
			arguments.push_back(join("local_size_z = ", get<SPIRConstant>(wg_z.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_z)
		arguments.push_back(join("local_size_z = ", get<SPIRConstant>(execution.workgroup_size.id_z).scalar()));
	else
		arguments.push_back(join("local_size_z = ", execution.workgroup_size.z));
}